

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_5::SetMessageVariables
               (FieldDescriptor *descriptor,Options *options,bool implicit_weak,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  mapped_type *pmVar2;
  Descriptor *pDVar3;
  string *psVar4;
  Options *pOVar5;
  allocator local_3d9;
  key_type local_3d8;
  allocator local_3b1;
  key_type local_3b0;
  allocator local_389;
  string local_388;
  string local_368;
  allocator local_341;
  key_type local_340;
  byte local_31e;
  allocator local_31d;
  byte local_31c;
  byte local_31b;
  byte local_31a;
  allocator local_319;
  key_type local_318;
  byte local_2f5;
  byte local_2f4;
  byte local_2f3;
  byte local_2f2;
  allocator local_2f1;
  key_type local_2f0;
  byte local_2cd;
  byte local_2cc;
  byte local_2cb;
  byte local_2ca;
  allocator local_2c9;
  key_type local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator local_1e1;
  key_type local_1e0;
  string local_1c0;
  allocator local_199;
  key_type local_198;
  string local_178;
  allocator local_151;
  key_type local_150;
  allocator local_129;
  key_type local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  key_type local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  allocator local_69;
  key_type local_68;
  string local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Options *pOStack_18;
  bool implicit_weak_local;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  
  local_28 = variables;
  variables_local._7_1_ = implicit_weak;
  pOStack_18 = options;
  options_local = (Options *)descriptor;
  SetCommonFieldVariables(descriptor,variables,options);
  FieldMessageTypeName_abi_cxx11_
            (&local_48,(cpp *)options_local,(FieldDescriptor *)pOStack_18,(Options *)variables);
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"type",&local_69);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_68);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_48);
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"type",&local_e1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_e0);
  std::operator+(&local_c0,pmVar2,"*");
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"name",&local_129);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_128);
  std::operator+(&local_108,pmVar2,"_");
  pOVar5 = (Options *)(ulong)(variables_local._7_1_ & 1);
  ReinterpretCast(&local_a0,&local_c0,&local_108,SUB41(variables_local._7_1_ & 1,0));
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"casted_member",&local_151);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_150);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)options_local);
  QualifiedDefaultInstanceName_abi_cxx11_(&local_178,(cpp *)pDVar3,(Descriptor *)pOStack_18,pOVar5);
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"type_default_instance",&local_199);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_198);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string((string *)&local_178);
  pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)options_local);
  QualifiedDefaultInstancePtr_abi_cxx11_(&local_1c0,(cpp *)pDVar3,(Descriptor *)pOStack_18,pOVar5);
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"type_default_instance_ptr",&local_1e1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1e0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string((string *)&local_1c0);
  pmVar1 = local_28;
  local_2ca = 0;
  local_2cb = 0;
  local_2cc = 0;
  local_2cd = 0;
  local_2f2 = 0;
  local_2f3 = 0;
  local_2f4 = 0;
  local_2f5 = 0;
  local_31a = 0;
  local_31b = 0;
  local_31c = 0;
  local_31e = 0;
  if ((variables_local._7_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    local_31e = 1;
    std::__cxx11::string::string((string *)&local_208,"",&local_31d);
  }
  else {
    std::allocator<char>::allocator();
    local_2ca = 1;
    std::__cxx11::string::string((string *)&local_2c8,"proto_ns",&local_2c9);
    local_2cb = 1;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_2c8);
    std::operator+(&local_2a8,"  ::",pmVar2);
    local_2cc = 1;
    std::operator+(&local_288,&local_2a8,"::internal::StrongReference(reinterpret_cast<const ");
    pmVar1 = local_28;
    local_2cd = 1;
    std::allocator<char>::allocator();
    local_2f2 = 1;
    std::__cxx11::string::string((string *)&local_2f0,"type",&local_2f1);
    local_2f3 = 1;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_2f0);
    std::operator+(&local_268,&local_288,pmVar2);
    local_2f4 = 1;
    std::operator+(&local_248,&local_268,"&>(\n");
    pmVar1 = local_28;
    local_2f5 = 1;
    std::allocator<char>::allocator();
    local_31a = 1;
    std::__cxx11::string::string((string *)&local_318,"type_default_instance",&local_319);
    local_31b = 1;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_318);
    std::operator+(&local_228,&local_248,pmVar2);
    local_31c = 1;
    std::operator+(&local_208,&local_228,"));\n");
  }
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"type_reference_function",&local_341);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_340);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string((string *)&local_208);
  if ((local_31e & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31d);
  }
  if ((local_31c & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_228);
  }
  if ((local_31b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_318);
  }
  if ((local_31a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
  }
  if ((local_2f5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_248);
  }
  if ((local_2f4 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_268);
  }
  if ((local_2f3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  if ((local_2f2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  }
  if ((local_2cd & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_288);
  }
  if ((local_2cc & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if ((local_2cb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  if ((local_2ca & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  }
  pDVar3 = FieldDescriptor::containing_type((FieldDescriptor *)options_local);
  pOVar5 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_388,"release_",&local_389);
  SafeFunctionName(&local_368,pDVar3,(FieldDescriptor *)pOVar5,&local_388);
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b0,"release_name",&local_3b1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_3b0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_368);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)options_local);
  pmVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8,"full_name",&local_3d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_3d8);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  return;
}

Assistant:

void SetMessageVariables(const FieldDescriptor* descriptor,
                         const Options& options, bool implicit_weak,
                         std::map<std::string, std::string>* variables) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["type"] = FieldMessageTypeName(descriptor, options);
  (*variables)["casted_member"] = ReinterpretCast(
      (*variables)["type"] + "*", (*variables)["name"] + "_", implicit_weak);
  (*variables)["type_default_instance"] =
      QualifiedDefaultInstanceName(descriptor->message_type(), options);
  (*variables)["type_default_instance_ptr"] =
      QualifiedDefaultInstancePtr(descriptor->message_type(), options);
  (*variables)["type_reference_function"] =
      implicit_weak ? ("  ::" + (*variables)["proto_ns"] +
                       "::internal::StrongReference(reinterpret_cast<const " +
                       (*variables)["type"] + "&>(\n" +
                       (*variables)["type_default_instance"] + "));\n")
                    : "";
  // NOTE: Escaped here to unblock proto1->proto2 migration.
  // TODO(liujisi): Extend this to apply for other conflicting methods.
  (*variables)["release_name"] =
      SafeFunctionName(descriptor->containing_type(), descriptor, "release_");
  (*variables)["full_name"] = descriptor->full_name();
}